

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O2

void __thiscall cmCursesMainForm::UpdateStatusBar(cmCursesMainForm *this,char *message)

{
  short sVar1;
  cmState *pcVar2;
  uint uVar3;
  FIELD *field;
  long *plVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  size_t sVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  char fmt_s [3];
  char help [128];
  char bar [512];
  char vertmp [128];
  char version [512];
  
  if ((_stdscr == 0) || (*(short *)(_stdscr + 6) < 0x40)) {
LAB_00267cc5:
    curses_clear();
    move(0,0);
    builtin_strncpy(bar + 0x30," required.",0xb);
    builtin_strncpy(bar + 0x20,"t least %dx%d is",0x10);
    builtin_strncpy(bar + 0x10,"all. A size of a",0x10);
    builtin_strncpy(bar,"Window is too sm",0x10);
    iVar9 = 0x41;
    if (0x41 < this->InitialWidth) {
      iVar9 = this->InitialWidth;
    }
    printw(bar,iVar9,6);
    if (_stdscr == 0) {
      uVar10 = 0xffffffffffffffff;
    }
    else {
      uVar10 = (ulong)((int)*(short *)(_stdscr + 4) + 1);
    }
    wtouchln(_stdscr,0,uVar10,1);
    wrefresh(_stdscr);
    return;
  }
  sVar1 = *(short *)(_stdscr + 4);
  uVar11 = (int)*(short *)(_stdscr + 6) + 1;
  if (sVar1 < 5 || (int)uVar11 < this->InitialWidth) goto LAB_00267cc5;
  field = current_field((this->super_cmCursesForm).Form);
  uVar3 = field_index(field);
  if ((int)uVar3 < 0) {
LAB_00267ee3:
    help[0x78] = '\0';
    help[0x79] = '\0';
    help[0x7a] = '\0';
    help[0x7b] = '\0';
    help[0x7c] = '\0';
    help[0x7d] = '\0';
    help[0x7e] = '\0';
    help[0x7f] = '\0';
    help[0x70] = '\0';
    help[0x71] = '\0';
    help[0x72] = '\0';
    help[0x73] = '\0';
    help[0x74] = '\0';
    help[0x75] = '\0';
    help[0x76] = '\0';
    help[0x77] = '\0';
    help[0x68] = '\0';
    help[0x69] = '\0';
    help[0x6a] = '\0';
    help[0x6b] = '\0';
    help[0x6c] = '\0';
    help[0x6d] = '\0';
    help[0x6e] = '\0';
    help[0x6f] = '\0';
    help[0x60] = '\0';
    help[0x61] = '\0';
    help[0x62] = '\0';
    help[99] = '\0';
    help[100] = '\0';
    help[0x65] = '\0';
    help[0x66] = '\0';
    help[0x67] = '\0';
    help[0x58] = '\0';
    help[0x59] = '\0';
    help[0x5a] = '\0';
    help[0x5b] = '\0';
    help[0x5c] = '\0';
    help[0x5d] = '\0';
    help[0x5e] = '\0';
    help[0x5f] = '\0';
    help[0x50] = '\0';
    help[0x51] = '\0';
    help[0x52] = '\0';
    help[0x53] = '\0';
    help[0x54] = '\0';
    help[0x55] = '\0';
    help[0x56] = '\0';
    help[0x57] = '\0';
    help[0x48] = '\0';
    help[0x49] = '\0';
    help[0x4a] = '\0';
    help[0x4b] = '\0';
    help[0x4c] = '\0';
    help[0x4d] = '\0';
    help[0x4e] = '\0';
    help[0x4f] = '\0';
    help[0x40] = '\0';
    help[0x41] = '\0';
    help[0x42] = '\0';
    help[0x43] = '\0';
    help[0x44] = '\0';
    help[0x45] = '\0';
    help[0x46] = '\0';
    help[0x47] = '\0';
    help[0x38] = '\0';
    help[0x39] = '\0';
    help[0x3a] = '\0';
    help[0x3b] = '\0';
    help[0x3c] = '\0';
    help[0x3d] = '\0';
    help[0x3e] = '\0';
    help[0x3f] = '\0';
    help[0x30] = '\0';
    help[0x31] = '\0';
    help[0x32] = '\0';
    help[0x33] = '\0';
    help[0x34] = '\0';
    help[0x35] = '\0';
    help[0x36] = '\0';
    help[0x37] = '\0';
    help[0x28] = '\0';
    help[0x29] = '\0';
    help[0x2a] = '\0';
    help[0x2b] = '\0';
    help[0x2c] = '\0';
    help[0x2d] = '\0';
    help[0x2e] = '\0';
    help[0x2f] = '\0';
    help[0x20] = '\0';
    help[0x21] = '\0';
    help[0x22] = '\0';
    help[0x23] = '\0';
    help[0x24] = '\0';
    help[0x25] = '\0';
    help[0x26] = '\0';
    help[0x27] = '\0';
    help[0x18] = '\0';
    help[0x19] = '\0';
    help[0x1a] = '\0';
    help[0x1b] = '\0';
    help[0x1c] = '\0';
    help[0x1d] = '\0';
    help[0x1e] = '\0';
    help[0x1f] = '\0';
    help[0x10] = '\0';
    help[0x11] = '\0';
    help[0x12] = '\0';
    help[0x13] = '\0';
    help[0x14] = '\0';
    help[0x15] = '\0';
    help[0x16] = '\0';
    help[0x17] = '\0';
    help[8] = '\0';
    help[9] = '\0';
    help[10] = '\0';
    help[0xb] = '\0';
    help[0xc] = '\0';
    help[0xd] = '\0';
    help[0xe] = '\0';
    help[0xf] = '\0';
    help[0] = '\0';
    help[1] = '\0';
    help[2] = '\0';
    help[3] = '\0';
    help[4] = '\0';
    help[5] = '\0';
    help[6] = '\0';
    help[7] = '\0';
    pcVar5 = "";
  }
  else {
    plVar4 = (long *)field_userptr(this->Fields[(ulong)uVar3 - 2]);
    help[0x70] = '\0';
    help[0x71] = '\0';
    help[0x72] = '\0';
    help[0x73] = '\0';
    help[0x74] = '\0';
    help[0x75] = '\0';
    help[0x76] = '\0';
    help[0x77] = '\0';
    help[0x78] = '\0';
    help[0x79] = '\0';
    help[0x7a] = '\0';
    help[0x7b] = '\0';
    help[0x7c] = '\0';
    help[0x7d] = '\0';
    help[0x7e] = '\0';
    help[0x7f] = '\0';
    help[0x60] = '\0';
    help[0x61] = '\0';
    help[0x62] = '\0';
    help[99] = '\0';
    help[100] = '\0';
    help[0x65] = '\0';
    help[0x66] = '\0';
    help[0x67] = '\0';
    help[0x68] = '\0';
    help[0x69] = '\0';
    help[0x6a] = '\0';
    help[0x6b] = '\0';
    help[0x6c] = '\0';
    help[0x6d] = '\0';
    help[0x6e] = '\0';
    help[0x6f] = '\0';
    help[0x50] = '\0';
    help[0x51] = '\0';
    help[0x52] = '\0';
    help[0x53] = '\0';
    help[0x54] = '\0';
    help[0x55] = '\0';
    help[0x56] = '\0';
    help[0x57] = '\0';
    help[0x58] = '\0';
    help[0x59] = '\0';
    help[0x5a] = '\0';
    help[0x5b] = '\0';
    help[0x5c] = '\0';
    help[0x5d] = '\0';
    help[0x5e] = '\0';
    help[0x5f] = '\0';
    help[0x40] = '\0';
    help[0x41] = '\0';
    help[0x42] = '\0';
    help[0x43] = '\0';
    help[0x44] = '\0';
    help[0x45] = '\0';
    help[0x46] = '\0';
    help[0x47] = '\0';
    help[0x48] = '\0';
    help[0x49] = '\0';
    help[0x4a] = '\0';
    help[0x4b] = '\0';
    help[0x4c] = '\0';
    help[0x4d] = '\0';
    help[0x4e] = '\0';
    help[0x4f] = '\0';
    help[0x30] = '\0';
    help[0x31] = '\0';
    help[0x32] = '\0';
    help[0x33] = '\0';
    help[0x34] = '\0';
    help[0x35] = '\0';
    help[0x36] = '\0';
    help[0x37] = '\0';
    help[0x38] = '\0';
    help[0x39] = '\0';
    help[0x3a] = '\0';
    help[0x3b] = '\0';
    help[0x3c] = '\0';
    help[0x3d] = '\0';
    help[0x3e] = '\0';
    help[0x3f] = '\0';
    help[0x20] = '\0';
    help[0x21] = '\0';
    help[0x22] = '\0';
    help[0x23] = '\0';
    help[0x24] = '\0';
    help[0x25] = '\0';
    help[0x26] = '\0';
    help[0x27] = '\0';
    help[0x28] = '\0';
    help[0x29] = '\0';
    help[0x2a] = '\0';
    help[0x2b] = '\0';
    help[0x2c] = '\0';
    help[0x2d] = '\0';
    help[0x2e] = '\0';
    help[0x2f] = '\0';
    help[0x10] = '\0';
    help[0x11] = '\0';
    help[0x12] = '\0';
    help[0x13] = '\0';
    help[0x14] = '\0';
    help[0x15] = '\0';
    help[0x16] = '\0';
    help[0x17] = '\0';
    help[0x18] = '\0';
    help[0x19] = '\0';
    help[0x1a] = '\0';
    help[0x1b] = '\0';
    help[0x1c] = '\0';
    help[0x1d] = '\0';
    help[0x1e] = '\0';
    help[0x1f] = '\0';
    help[0] = '\0';
    help[1] = '\0';
    help[2] = '\0';
    help[3] = '\0';
    help[4] = '\0';
    help[5] = '\0';
    help[6] = '\0';
    help[7] = '\0';
    help[8] = '\0';
    help[9] = '\0';
    help[10] = '\0';
    help[0xb] = '\0';
    help[0xc] = '\0';
    help[0xd] = '\0';
    help[0xe] = '\0';
    help[0xf] = '\0';
    if (plVar4 == (long *)0x0) goto LAB_00267ee3;
    pcVar5 = (char *)(**(code **)(*plVar4 + 0x28))(plVar4);
    pcVar2 = this->CMakeInstance->State;
    std::__cxx11::string::string((string *)bar,pcVar5,(allocator *)version);
    pcVar6 = cmState::GetCacheEntryValue(pcVar2,(string *)bar);
    std::__cxx11::string::~string((string *)bar);
    if (pcVar6 == (char *)0x0) {
      help[0] = ' ';
      help[1] = '\0';
    }
    else {
      pcVar2 = this->CMakeInstance->State;
      std::__cxx11::string::string((string *)bar,pcVar5,(allocator *)vertmp);
      std::__cxx11::string::string((string *)version,"HELPSTRING",(allocator *)fmt_s);
      pcVar6 = cmState::GetCacheEntryProperty(pcVar2,(string *)bar,(string *)version);
      std::__cxx11::string::~string((string *)version);
      std::__cxx11::string::~string((string *)bar);
      if (pcVar6 == (char *)0x0) {
        help._0_8_ = help._0_8_ & 0xffffffffffffff00;
      }
      else {
        strncpy(help,pcVar6,0x7f);
        help._120_8_ = help._120_8_ & 0xffffffffffffff;
      }
    }
  }
  sVar7 = strlen(pcVar5);
  sVar8 = strlen(help);
  uVar3 = 0x200;
  if (uVar11 < 0x200) {
    uVar3 = uVar11;
  }
  uVar10 = (ulong)uVar3;
  if (message == (char *)0x0) {
    message = pcVar5;
    if (sVar7 < uVar10) {
      strcpy(bar,pcVar5);
      (bar + sVar7)[0] = ':';
      (bar + sVar7)[1] = ' ';
      uVar13 = sVar8 + sVar7 + 2;
      if (uVar13 < uVar10) {
        strcpy(bar + sVar7 + 2,help);
        for (; uVar13 < uVar10; uVar13 = uVar13 + 1) {
          bar[uVar13] = ' ';
        }
      }
      else {
        strncpy(bar + sVar7 + 2,help,(uVar10 - sVar7) - 2);
      }
      goto LAB_00267ff3;
    }
  }
  else {
    sVar7 = strlen(message);
    if (sVar7 < uVar10) {
      strcpy(bar,message);
      for (; uVar10 != sVar7; sVar7 = sVar7 + 1) {
        bar[sVar7] = ' ';
      }
      goto LAB_00267ff3;
    }
  }
  strncpy(bar,message,uVar10);
LAB_00267ff3:
  bar[uVar10] = '\0';
  pcVar5 = cmVersion::GetCMakeVersion();
  sprintf(vertmp,"CMake Version %s",pcVar5);
  sVar7 = strlen(vertmp);
  for (lVar12 = 0; uVar10 - sVar7 != lVar12; lVar12 = lVar12 + 1) {
    version[lVar12] = ' ';
  }
  strcpy(version + (uVar10 - sVar7),vertmp);
  version[uVar10] = '\0';
  fmt_s[2] = '\0';
  fmt_s[0] = '%';
  fmt_s[1] = 's';
  move(sVar1 + -4,0);
  wattr_on(_stdscr,0x10000,0);
  printw(fmt_s,bar);
  wattr_off(_stdscr,0x10000,0);
  move(sVar1 + -3,0);
  printw(fmt_s,version);
  pos_form_cursor((this->super_cmCursesForm).Form);
  return;
}

Assistant:

void cmCursesMainForm::UpdateStatusBar(const char* message)
{
  int x,y;
  getmaxyx(stdscr, y, x);
  // If window size is too small, display error and return
  if ( x < cmCursesMainForm::MIN_WIDTH  ||
       x < this->InitialWidth               ||
       y < cmCursesMainForm::MIN_HEIGHT )
    {
    curses_clear();
    curses_move(0,0);
    char fmt[] = "Window is too small. A size of at least %dx%d is required.";
    printw(fmt,
           (cmCursesMainForm::MIN_WIDTH < this->InitialWidth ?
            this->InitialWidth : cmCursesMainForm::MIN_WIDTH),
           cmCursesMainForm::MIN_HEIGHT);
    touchwin(stdscr);
    wrefresh(stdscr);
    return;
    }

  // Get the key of the current entry
  FIELD* cur = current_field(this->Form);
  int findex = field_index(cur);
  cmCursesWidget* lbl = 0;
  if ( findex >= 0 )
    {
    lbl = reinterpret_cast<cmCursesWidget*>(field_userptr(this->Fields[findex-2]));
    }
  char help[128] = "";
  const char* curField = "";
  if ( lbl )
    {
    curField = lbl->GetValue();

    // Get the help string of the current entry
    // and add it to the help string
    const char* existingValue =
        this->CMakeInstance->GetState()->GetCacheEntryValue(curField);
    if (existingValue)
      {
      const char* hs = this->CMakeInstance->GetState()
                           ->GetCacheEntryProperty(curField, "HELPSTRING");
      if ( hs )
        {
        strncpy(help, hs, 127);
        help[127] = '\0';
        }
      else
        {
        help[0] = 0;
        }
      }
    else
      {
      sprintf(help," ");
      }
    }

  // Join the key, help string and pad with spaces
  // (or truncate) as necessary
  char bar[cmCursesMainForm::MAX_WIDTH];
  size_t i, curFieldLen = strlen(curField);
  size_t helpLen = strlen(help);

  size_t width;
  if (x < cmCursesMainForm::MAX_WIDTH )
    {
    width = x;
    }
  else
    {
    width = cmCursesMainForm::MAX_WIDTH;
    }

  if ( message )
    {
    curField = message;
    curFieldLen = strlen(message);
    if ( curFieldLen < width )
      {
      strcpy(bar, curField);
      for(i=curFieldLen; i < width; ++i)
        {
        bar[i] = ' ';
        }
      }
    else
      {
      strncpy(bar, curField, width);
      }
   }
  else
    {
    if (curFieldLen >= width)
      {
      strncpy(bar, curField, width);
      }
    else
      {
      strcpy(bar, curField);
      bar[curFieldLen] = ':';
      bar[curFieldLen+1] = ' ';
      if (curFieldLen + helpLen + 2 >= width)
        {
        strncpy(bar+curFieldLen+2, help, width
                - curFieldLen - 2);
        }
      else
        {
        strcpy(bar+curFieldLen+2, help);
        for(i=curFieldLen+helpLen+2; i < width; ++i)
          {
          bar[i] = ' ';
          }
        }
      }
    }


  bar[width] = '\0';


  // Display CMake version info on the next line
  // We want to display this on the right
  char version[cmCursesMainForm::MAX_WIDTH];
  char vertmp[128];
  sprintf(vertmp,"CMake Version %s", cmVersion::GetCMakeVersion());
  size_t sideSpace = (width-strlen(vertmp));
  for(i=0; i<sideSpace; i++) { version[i] = ' '; }
  sprintf(version+sideSpace, "%s", vertmp);
  version[width] = '\0';

  // Now print both lines
  char fmt_s[] = "%s";
  curses_move(y-5,0);
  attron(A_STANDOUT);
  printw(fmt_s, bar);
  attroff(A_STANDOUT);
  curses_move(y-4,0);
  printw(fmt_s, version);
  pos_form_cursor(this->Form);
}